

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ImGuiKey IVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float logarithmic_zero_epsilon;
  
  pIVar3 = GImGui;
  iVar2 = v_min - v_max;
  if (v_min < v_max) {
    iVar2 = -(v_min - v_max);
  }
  uVar7 = flags & 0x100000;
  uVar9 = data_type & 0xfffffffe;
  fVar20 = *(float *)((long)&(bb->Min).x + (ulong)(uVar7 >> 0x12));
  fVar18 = *(float *)((long)&(bb->Max).x + (ulong)(uVar7 >> 0x12));
  fVar16 = (fVar18 - fVar20) + -4.0;
  fVar19 = (GImGui->Style).GrabMinSize;
  if (-1 < iVar2 && uVar9 != 8) {
    fVar14 = fVar16 / (float)(iVar2 + 1);
    uVar10 = -(uint)(fVar19 <= fVar14);
    fVar19 = (float)(~uVar10 & (uint)fVar19 | (uint)fVar14 & uVar10);
  }
  if (fVar16 <= fVar19) {
    fVar19 = fVar16;
  }
  fVar15 = fVar16 - fVar19;
  fVar11 = -fVar19;
  fVar14 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar9 == 8) {
      iVar6 = ImParseFormatPrecision(format,3);
      fVar14 = (float)iVar6;
    }
    else {
      fVar14 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar14);
    fVar14 = fVar15;
    if (fVar15 <= 1.0) {
      fVar14 = 1.0;
    }
    fVar14 = ((pIVar3->Style).LogSliderDeadzone * 0.5) / fVar14;
  }
  fVar20 = fVar20 + 2.0 + fVar19 * 0.5;
  fVar18 = (fVar18 + -2.0) - fVar19 * 0.5;
  if (pIVar3->ActiveId == id) {
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar3->ActiveIdIsJustActivated == true) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      if (uVar7 == 0) {
        fVar15 = GetNavTweakPressedAmount(ImGuiAxis_X);
      }
      else {
        fVar15 = GetNavTweakPressedAmount(ImGuiAxis_Y);
        fVar15 = -fVar15;
      }
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        IVar8 = ImGuiKey_ModCtrl;
        if (pIVar3->NavInputSource == ImGuiInputSource_Gamepad) {
          IVar8 = ImGuiKey_GamepadL1;
        }
        bVar4 = IsKeyDown(IVar8);
        IVar8 = ImGuiKey_ModShift;
        if (pIVar3->NavInputSource == ImGuiInputSource_Gamepad) {
          IVar8 = ImGuiKey_GamepadR1;
        }
        bVar5 = IsKeyDown(IVar8);
        if ((uVar9 == 8) && (iVar6 = ImParseFormatPrecision(format,3), 0 < iVar6)) {
          fVar15 = fVar15 / 100.0;
          if (bVar4) {
            fVar15 = fVar15 / 10.0;
          }
        }
        else if (iVar2 + 100U < 0xc9 || bVar4) {
          fVar15 = *(float *)(&DAT_0022b5e8 + (ulong)(fVar15 < 0.0) * 4) / (float)iVar2;
        }
        else {
          fVar15 = fVar15 / 100.0;
        }
        if (bVar5) {
          fVar15 = fVar15 * 10.0;
        }
        fVar15 = fVar15 + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccum = fVar15;
        pIVar3->SliderCurrentAccumDirty = true;
      }
      else {
        fVar15 = pIVar3->SliderCurrentAccum;
      }
      if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar3->SliderCurrentAccumDirty == true) {
        bVar4 = SUB41((flags & 0x20U) >> 5,0);
        fVar13 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,*v,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar14);
        if (((1.0 <= fVar13) && (0.0 < fVar15)) || ((fVar13 <= 0.0 && (fVar15 < 0.0)))) {
          pIVar3->SliderCurrentAccum = 0.0;
          pIVar3->SliderCurrentAccumDirty = false;
          bVar4 = false;
          goto LAB_001fe80d;
        }
        fVar17 = fVar15 + fVar13;
        fVar12 = 1.0;
        if (fVar17 <= 1.0) {
          fVar12 = fVar17;
        }
        fVar12 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar12);
        uVar10 = ScaleValueFromRatioT<unsigned_int,int,float>
                           (data_type,fVar12,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar14);
        if (uVar9 == 8 && (flags & 0x40U) == 0) {
          uVar10 = RoundScalarWithFormatT<unsigned_int>(format,data_type,uVar10);
        }
        fVar17 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar10,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar14);
        fVar17 = fVar17 - fVar13;
        bVar4 = fVar15 <= fVar17;
        if (0.0 < fVar15) {
          bVar4 = fVar17 < fVar15;
        }
        if (!bVar4) {
          fVar17 = fVar15;
        }
        pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar17;
        pIVar3->SliderCurrentAccumDirty = false;
        goto LAB_001fe711;
      }
      bVar4 = false;
      goto LAB_001fe80d;
    }
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        fVar13 = (pIVar3->IO).NavInputs[(ulong)(uVar7 >> 0x14) + 0x10];
        if (pIVar3->ActiveIdIsJustActivated == true) {
          fVar12 = ScaleRatioFromValueT<unsigned_int,int,float>
                             (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                              logarithmic_zero_epsilon,fVar14);
          if (uVar7 != 0) {
            fVar12 = 1.0 - fVar12;
          }
          fVar12 = (fVar18 - fVar20) * fVar12 + fVar20;
          fVar17 = 0.0;
          if (fVar13 <= fVar19 * 0.5 + fVar12 + 1.0 && fVar11 * 0.5 + fVar12 + -1.0 <= fVar13) {
            fVar17 = fVar13 - fVar12;
          }
          fVar12 = 0.0;
          if (uVar9 == 8) {
            fVar12 = fVar17;
          }
          pIVar3->SliderGrabClickOffset = fVar12;
        }
        fVar12 = 0.0;
        if (0.0 < fVar15) {
          fVar15 = ((fVar13 - pIVar3->SliderGrabClickOffset) - fVar20) / fVar15;
          fVar12 = 1.0;
          if (fVar15 <= 1.0) {
            fVar12 = fVar15;
          }
          fVar12 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar12);
        }
        if (uVar7 != 0) {
          fVar12 = 1.0 - fVar12;
        }
LAB_001fe711:
        uVar10 = ScaleValueFromRatioT<unsigned_int,int,float>
                           (data_type,fVar12,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                            logarithmic_zero_epsilon,fVar14);
        if (uVar9 == 8 && (flags & 0x40U) == 0) {
          uVar10 = RoundScalarWithFormatT<unsigned_int>(format,data_type,uVar10);
        }
        if (*v == uVar10) {
          bVar4 = false;
        }
        else {
          *v = uVar10;
          bVar4 = true;
        }
        goto LAB_001fe80d;
      }
      ClearActiveID();
    }
  }
  bVar4 = false;
LAB_001fe80d:
  if (1.0 <= fVar16) {
    fVar16 = ScaleRatioFromValueT<unsigned_int,int,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar14);
    if (uVar7 != 0) {
      fVar16 = 1.0 - fVar16;
    }
    fVar20 = (fVar18 - fVar20) * fVar16 + fVar20;
    if (uVar7 != 0) {
      fVar18 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = fVar11 * 0.5 + fVar20;
      (out_grab_bb->Max).x = fVar18 + -2.0;
      (out_grab_bb->Max).y = fVar19 * 0.5 + fVar20;
    }
    else {
      fVar18 = (bb->Min).y;
      fVar16 = (bb->Max).y;
      (out_grab_bb->Min).x = fVar11 * 0.5 + fVar20;
      (out_grab_bb->Min).y = fVar18 + 2.0;
      (out_grab_bb->Max).x = fVar19 * 0.5 + fVar20;
      (out_grab_bb->Max).y = fVar16 + -2.0;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar4;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}